

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cpp
# Opt level: O3

void __thiscall
cppgenerate::Method::printSignature(Method *this,ostream *stream,int indent,bool withAccessModifier)

{
  AccessModifier AVar1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  string local_48;
  
  if ((this->m_name)._M_string_length < 2) {
    return;
  }
  if ((this->m_returnType)._M_string_length < 2) {
    return;
  }
  cVar2 = (char)stream;
  if (withAccessModifier) {
    AVar1 = this->m_access;
    if (AVar1 == PUBLIC) {
      pcVar5 = "public:";
      lVar4 = 7;
    }
    else if (AVar1 == PROTECTED) {
      pcVar5 = "protected:";
      lVar4 = 10;
    }
    else {
      if (AVar1 != PRIVATE) goto LAB_0011029a;
      pcVar5 = "private:";
      lVar4 = 8;
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar5,lVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
LAB_0011029a:
  if (1 < (this->m_documentation)._M_string_length) {
    insertSpaces(stream,indent);
    std::__ostream_insert<char,std::char_traits<char>>(stream,"/** ",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(this->m_documentation)._M_dataplus._M_p,
                        (this->m_documentation)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," */",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  insertSpaces(stream,indent);
  if (this->m_isStatic == true) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"static ",7);
  }
  if (this->m_isVirtual == true) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"virtual ",8);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  printMethodSignature(this,stream,&local_48,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (this->m_isPureVirtual == true) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," = 0",4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

bool Method::isValid() const {
    return m_name.size() > 1 && m_returnType.size() > 1;
}